

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O2

bool __thiscall
Jinx::Impl::Library::RegisterPropertyName
          (Library *this,PropertyName *propertyName,bool checkForDuplicates)

{
  bool bVar1;
  
  std::mutex::lock(&this->m_propertyMutex);
  bVar1 = RegisterPropertyNameInternal(this,propertyName,checkForDuplicates);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
  return bVar1;
}

Assistant:

inline_t bool Library::RegisterPropertyName(const PropertyName & propertyName, bool checkForDuplicates)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return RegisterPropertyNameInternal(propertyName, checkForDuplicates);
	}